

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O3

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
getPredefinedTransformations1Plane3Line<float>
          (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           *__return_storage_ptr__,Matrix<float,_4,_1,_0,_4,_1> *Pi,Matrix<float,_4,_1,_0,_4,_1> *Nu
          ,bool verbose)

{
  float fVar1;
  iterator iVar2;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pCVar3;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *pCVar4;
  long lVar5;
  ostream *poVar6;
  char *__function;
  DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *pDVar7;
  float fVar8;
  float fVar9;
  Matrix<float,_3,_1,_0,_3,_1> auxT;
  Matrix<float,_4,_4,_0,_4,_4> auxTrans;
  Matrix<float,_3,_3,_0,_3,_3> auxRot;
  float local_160;
  Scalar local_15c;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> local_158;
  float local_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  float local_124;
  float local_120;
  float local_11c;
  float local_118;
  float local_114;
  float local_110;
  float local_10c;
  float local_108;
  float local_104;
  float fStack_100;
  float local_fc;
  undefined1 local_f8 [16];
  Matrix<float,_4,_4,_0,_4,_4> local_e8;
  float local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  double local_70;
  undefined1 local_68 [16];
  undefined4 local_54 [9];
  
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8 = ZEXT416((uint)(Pi->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
                           m_storage.m_data.array[0]);
  local_138 = (Pi->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[1];
  fVar9 = (Pi->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [2];
  local_120 = (Pi->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  local_88 = ZEXT416((uint)(Nu->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
                           m_storage.m_data.array[0]);
  fVar1 = (Nu->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [1];
  local_98 = ZEXT416((uint)(Nu->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
                           m_storage.m_data.array[2]);
  local_124 = (Nu->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array[3];
  pDVar7 = (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_54;
  local_158.m_row = 0;
  local_158.m_col = 1;
  local_158.m_currentBlockRows = 1;
  local_54[0] = 0;
  local_68 = ZEXT416((uint)fVar9);
  local_a8 = local_138 * local_138;
  fVar8 = SQRT(local_a8 + fVar9 * fVar9);
  local_15c = -fVar9 / fVar8;
  local_158.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)pDVar7;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (&local_158,&local_15c);
  local_160 = local_138 / fVar8;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_160);
  fVar9 = SQRT(fVar9 * fVar9 + (float)local_f8._0_4_ * (float)local_f8._0_4_ + local_a8);
  local_108 = fVar8 / fVar9;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_108);
  local_a8 = -(float)local_f8._0_4_;
  uStack_a4 = local_f8._4_4_ ^ 0x80000000;
  uStack_a0 = local_f8._8_4_ ^ 0x80000000;
  uStack_9c = local_f8._12_4_ ^ 0x80000000;
  local_70 = (double)fVar9;
  local_10c = (float)(((double)(local_138 * local_a8) / (double)fVar8) / local_70);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_10c);
  local_110 = (float)(((double)(local_a8 * (float)local_68._0_4_) / (double)fVar8) / local_70);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_110);
  local_114 = (float)local_f8._0_4_ / fVar9;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_114);
  local_118 = local_138 / fVar9;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_118);
  local_11c = (float)local_68._0_4_ / fVar9;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar3,&local_11c);
  if (((DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
       (local_158.m_row + local_158.m_currentBlockRows) ==
       (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)0x3) && (local_158.m_col == 3)) {
    local_158.m_row = 0;
    local_158.m_col = 1;
    local_158.m_currentBlockRows = 1;
    local_104 = 0.0;
    local_15c = 0.0;
    local_158.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)&local_104;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_158,
                        &local_15c);
    local_160 = local_120 * fVar9;
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_(pCVar4,&local_160);
    if (((DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
         (local_158.m_row + local_158.m_currentBlockRows) ==
         (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)0x3) && (local_158.m_col == 1)) {
      local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
           = 1.0;
      local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
           = 0.0;
      local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
           = 0.0;
      local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
           = 0.0;
      local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4]
           = 0.0;
      local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5]
           = 1.0;
      local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6]
           = 0.0;
      local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7]
           = 0.0;
      local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8]
           = 0.0;
      local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9]
           = 0.0;
      local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [10] = 1.0;
      local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xb] = 0.0;
      local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xf] = 1.0;
      lVar5 = 0;
      do {
        *(undefined4 *)
         ((long)local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar5 + 8) = *(undefined4 *)(pDVar7 + 8);
        *(undefined8 *)
         ((long)local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array + lVar5) = *(undefined8 *)pDVar7;
        pDVar7 = pDVar7 + 0xc;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x30);
      local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xe] = local_fc;
      local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xd] = fStack_100;
      local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xc] = local_104;
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[VERBOSE] Matrix [U,u;0,0,0,1]",0x1e);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
        std::ostream::put('x');
        poVar6 = (ostream *)std::ostream::flush();
        poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                                          &local_e8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[VERBOSE] inv(T)*T = eye(3)",0x1b);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
        std::ostream::put('x');
        poVar6 = (ostream *)std::ostream::flush();
        local_158.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)&local_e8;
        local_158.m_row = (Index)&local_e8;
        poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                                           *)&local_158);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
      }
      iVar2._M_current =
           (__return_storage_ptr__->
           super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>::
        _M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                  ((vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                    *)__return_storage_ptr__,iVar2,&local_e8);
      }
      else {
        *(undefined8 *)
         (((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array + 0xc) =
             local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array._48_8_;
        *(ulong *)(((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>)
                   .m_storage.m_data.array + 0xe) =
             CONCAT44(local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[0xf],
                      local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[0xe]);
        *(undefined8 *)
         (((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array + 8) =
             local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array._32_8_;
        *(undefined8 *)
         (((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array + 10) =
             local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array._40_8_;
        *(ulong *)(((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>)
                   .m_storage.m_data.array + 4) =
             CONCAT44(local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[5],
                      local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[4]);
        *(undefined8 *)
         (((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array + 6) =
             local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
             array._24_8_;
        *(ulong *)((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                  m_storage.m_data.array =
             CONCAT44(local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[1],
                      local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[0]);
        *(ulong *)(((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>)
                   .m_storage.m_data.array + 2) =
             CONCAT44(local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[3],
                      local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage
                      .m_data.array[2]);
        (__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      pDVar7 = (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_54;
      local_158.m_row = 0;
      local_158.m_col = 1;
      local_158.m_currentBlockRows = 1;
      local_54[0] = 0;
      fVar8 = (float)local_98._0_4_ * (float)local_98._0_4_;
      local_138 = fVar1 * fVar1;
      fVar9 = SQRT(local_138 + fVar8);
      local_15c = -(float)local_98._0_4_ / fVar9;
      local_158.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)pDVar7;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (&local_158,&local_15c);
      local_160 = fVar1 / fVar9;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar3,&local_160);
      fVar8 = SQRT(fVar8 + (float)local_88._0_4_ * (float)local_88._0_4_ + local_138);
      local_108 = fVar9 / fVar8;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar3,&local_108);
      local_138 = -(float)local_88._0_4_;
      uStack_134 = local_88._4_4_ ^ 0x80000000;
      uStack_130 = local_88._8_4_ ^ 0x80000000;
      uStack_12c = local_88._12_4_ ^ 0x80000000;
      local_f8._0_8_ = (double)fVar8;
      local_10c = (float)(((double)(fVar1 * local_138) / (double)fVar9) / (double)fVar8);
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar3,&local_10c);
      local_110 = (float)(((double)(local_138 * (float)local_98._0_4_) / (double)fVar9) /
                         (double)local_f8._0_8_);
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar3,&local_110);
      local_114 = (float)local_88._0_4_ / fVar8;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar3,&local_114);
      local_118 = fVar1 / fVar8;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                         (pCVar3,&local_118);
      local_11c = (float)local_98._0_4_ / fVar8;
      Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar3,&local_11c);
      if (((DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
           (local_158.m_row + local_158.m_currentBlockRows) !=
           (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)0x3) || (local_158.m_col != 3))
      goto LAB_0014a3eb;
      local_158.m_row = 0;
      local_158.m_col = 1;
      local_158.m_currentBlockRows = 1;
      local_104 = 0.0;
      local_15c = 0.0;
      local_158.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)&local_104;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_158,
                          &local_15c);
      local_160 = local_124 * fVar8;
      Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_(pCVar4,&local_160);
      if (((DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
           (local_158.m_row + local_158.m_currentBlockRows) ==
           (DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)0x3) && (local_158.m_col == 1)) {
        local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0] = 1.0;
        local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [1] = 0.0;
        local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [2] = 0.0;
        local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [3] = 0.0;
        local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [4] = 0.0;
        local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [5] = 1.0;
        local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [6] = 0.0;
        local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [7] = 0.0;
        local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [8] = 0.0;
        local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [9] = 0.0;
        local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [10] = 1.0;
        local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xb] = 0.0;
        local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xf] = 1.0;
        lVar5 = 0;
        do {
          *(undefined4 *)
           ((long)local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar5 + 8) = *(undefined4 *)(pDVar7 + 8);
          *(undefined8 *)
           ((long)local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar5) = *(undefined8 *)pDVar7;
          pDVar7 = pDVar7 + 0xc;
          lVar5 = lVar5 + 0x10;
        } while (lVar5 != 0x30);
        local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xe] = local_fc;
        local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xd] = fStack_100;
        local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [0xc] = local_104;
        if (verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[VERBOSE] Matrix [V,v;0,0,0,1]",0x1e);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
          std::ostream::put('x');
          poVar6 = (ostream *)std::ostream::flush();
          poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                                            &local_e8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[VERBOSE] inv(T)*T = eye(3)",0x1b);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
          std::ostream::put('x');
          poVar6 = (ostream *)std::ostream::flush();
          local_158.m_xpr = (Matrix<float,_3,_3,_0,_3,_3> *)&local_e8;
          local_158.m_row = (Index)&local_e8;
          poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                                             *)&local_158);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
        }
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
          ::_M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                    ((vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                      *)__return_storage_ptr__,iVar2,&local_e8);
        }
        else {
          *(undefined8 *)
           (((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array + 0xc) =
               local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
               .array._48_8_;
          *(ulong *)(((iVar2._M_current)->
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array + 0xe) =
               CONCAT44(local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0xf],
                        local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0xe]);
          *(undefined8 *)
           (((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array + 8) =
               local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
               .array._32_8_;
          *(undefined8 *)
           (((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array + 10) =
               local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
               .array._40_8_;
          *(ulong *)(((iVar2._M_current)->
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array + 4) =
               CONCAT44(local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[5],
                        local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[4]);
          *(undefined8 *)
           (((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
            m_storage.m_data.array + 6) =
               local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
               .array._24_8_;
          *(ulong *)((iVar2._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                    ).m_storage.m_data.array =
               CONCAT44(local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[1],
                        local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0]);
          *(ulong *)(((iVar2._M_current)->
                     super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                     array + 2) =
               CONCAT44(local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[3],
                        local_e8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[2]);
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        return __return_storage_ptr__;
      }
    }
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 1>>::finished() [MatrixType = Eigen::Matrix<float, 3, 1>]"
    ;
  }
  else {
LAB_0014a3eb:
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 3>>::finished() [MatrixType = Eigen::Matrix<float, 3, 3>]"
    ;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,__function);
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> getPredefinedTransformations1Plane3Line(
	Matrix<floatPrec, 4, 1> Pi, Matrix<floatPrec, 4, 1> Nu,
	bool verbose)
{

	vector<Matrix<floatPrec, 4, 4>> outTrans;
	Matrix<floatPrec, 4, 4> auxTrans;
	Matrix<floatPrec, 3, 3> auxRot;
	Matrix<floatPrec, 3, 1> auxT;

	floatPrec pi11, pi12, pi13, pi14;
	floatPrec nu11, nu12, nu13, nu14;

	pi11 = Pi(0);
	pi12 = Pi(1);
	pi13 = Pi(2);
	pi14 = Pi(3);
	nu11 = Nu(0);
	nu12 = Nu(1);
	nu13 = Nu(2);
	nu14 = Nu(3);

	// Compute U Matrix
	auxRot << 0.0,
		-pi13 * 1.0 / sqrt(pi12 * pi12 + pi13 * pi13),
		pi12 * 1.0 / sqrt(pi12 * pi12 + pi13 * pi13),
		sqrt(pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		-pi11 * pi12 * 1.0 / sqrt(pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		-pi11 * pi13 * 1.0 / sqrt(pi12 * pi12 + pi13 * pi13) * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi11 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi12 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13),
		pi13 * 1.0 / sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13);

	// Compute u vector
	auxT << 0.0, 0.0, pi14 * sqrt(pi11 * pi11 + pi12 * pi12 + pi13 * pi13);

	auxTrans = Matrix<floatPrec, 4, 4>::Identity(4, 4);
	auxTrans.topLeftCorner(3, 3) = auxRot;
	auxTrans.topRightCorner(3, 1) = auxT;

	if (verbose)
		cout << "[VERBOSE] Matrix [U,u;0,0,0,1]" << endl
			 << auxTrans << endl;
	if (verbose)
		cout << "[VERBOSE] inv(T)*T = eye(3)" << endl
			 << auxTrans.inverse() * auxTrans << endl;

	// add U,u to the output vector
	outTrans.push_back(auxTrans);

	// Compute V Matrix
	auxRot << 0.0,
		-nu13 * 1.0 / sqrt(nu12 * nu12 + nu13 * nu13),
		nu12 * 1.0 / sqrt(nu12 * nu12 + nu13 * nu13),
		sqrt(nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		-nu11 * nu12 * 1.0 / sqrt(nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		-nu11 * nu13 * 1.0 / sqrt(nu12 * nu12 + nu13 * nu13) * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu11 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu12 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13),
		nu13 * 1.0 / sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13);

	// Compute v vector
	auxT << 0.0, 0.0, nu14 * sqrt(nu11 * nu11 + nu12 * nu12 + nu13 * nu13);

	auxTrans = Matrix<floatPrec, 4, 4>::Identity(4, 4);
	auxTrans.topLeftCorner(3, 3) = auxRot;
	auxTrans.topRightCorner(3, 1) = auxT;

	if (verbose)
		cout << "[VERBOSE] Matrix [V,v;0,0,0,1]" << endl
			 << auxTrans << endl;
	if (verbose)
		cout << "[VERBOSE] inv(T)*T = eye(3)" << endl
			 << auxTrans.inverse() * auxTrans << endl;

	// add V,v to the output vector
	outTrans.push_back(auxTrans);

	return outTrans;
}